

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-hand-collator.cpp
# Opt level: O0

void __thiscall
mahjong::WiningHandCollator::backtrackTripletOrQuad
          (WiningHandCollator *this,WiningHand *extended_hand,TileHolder *extended_holder)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_40 [8];
  Meld meld;
  TileHolder *extended_holder_local;
  WiningHand *extended_hand_local;
  WiningHandCollator *this_local;
  
  meld._24_8_ = extended_holder;
  TileHolder::popTripletOrQuadWithFrontTile((Meld *)local_40,extended_holder);
  bVar1 = Meld::isValid((Meld *)local_40);
  if ((bVar1) &&
     (sVar2 = std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::size
                        (&extended_hand->pairs), sVar2 < 2)) {
    std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::push_back
              (&extended_hand->melds,(value_type *)local_40);
    backtrack(this,extended_hand,extended_holder);
  }
  Meld::~Meld((Meld *)local_40);
  return;
}

Assistant:

void WiningHandCollator::backtrackTripletOrQuad(WiningHand extended_hand, TileHolder extended_holder)
{
	auto meld = extended_holder.popTripletOrQuadWithFrontTile();
	if (meld.isValid() && extended_hand.pairs.size() < 2)
	{
		extended_hand.melds.push_back(meld);
		backtrack(extended_hand, extended_holder);
	}
}